

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

ssize_t archive_write_zip_data(archive_write *a,void *buff,size_t s)

{
  uint uVar1;
  int iVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  size_t local_a0;
  size_t outl_2;
  size_t l_1;
  uint8_t *rh;
  uint8_t *header;
  size_t sh;
  uint8_t auStack_6d [4];
  uint8_t buf [9];
  size_t outl_1;
  size_t zret;
  size_t outl;
  size_t l;
  uint8_t *re;
  uint8_t *rb;
  zip_conflict *zip;
  size_t sStack_28;
  int ret;
  size_t s_local;
  void *buff_local;
  archive_write *a_local;
  
  rb = (uint8_t *)a->format_data;
  sStack_28 = s;
  if (*(long *)(rb + 0x28) < (long)s) {
    sStack_28 = *(size_t *)(rb + 0x28);
  }
  *(size_t *)(rb + 0x20) = sStack_28 + *(long *)(rb + 0x20);
  if (sStack_28 == 0) {
    return 0;
  }
  s_local = (size_t)buff;
  buff_local = a;
  if (((*(uint *)(rb + 0x44) & 1) != 0) && (iVar2 = *(int *)(rb + 0x40), iVar2 != 0)) {
    if (iVar2 == 1) {
      if (rb[0x58] == '\0') {
        iVar2 = init_traditional_pkware_encryption(a);
        if (iVar2 != 0) {
          return (long)iVar2;
        }
        rb[0x58] = '\x01';
        zip._4_4_ = 0;
      }
    }
    else if ((iVar2 - 2U < 2) && (rb[0xb8] == '\0')) {
      iVar2 = init_winzip_aes_encryption(a);
      if (iVar2 != 0) {
        return (long)iVar2;
      }
      rb[200] = '\x01';
      rb[0xb8] = '\x01';
      zip._4_4_ = 0;
    }
  }
  iVar2 = *(int *)(rb + 0x3c);
  if (iVar2 == -1) {
LAB_001cc882:
    archive_set_error((archive *)buff_local,-1,"Invalid ZIP compression type");
    return -0x1e;
  }
  if (iVar2 == 0) {
    if ((rb[0x58] == '\0') && (rb[0xb8] == '\0')) {
      iVar2 = __archive_write_output((archive_write *)buff_local,(void *)s_local,sStack_28);
      if (iVar2 != 0) {
        return (long)iVar2;
      }
      *(size_t *)(rb + 0x108) = sStack_28 + *(long *)(rb + 0x108);
      *(size_t *)(rb + 0x18) = sStack_28 + *(long *)(rb + 0x18);
      zip._4_4_ = 0;
    }
    else {
      l = sStack_28 + s_local;
      for (re = (uint8_t *)s_local; re < l; re = re + outl) {
        if (rb[0x58] == '\0') {
          outl = *(size_t *)(rb + 0x238);
          zip._4_4_ = aes_ctr_update((archive_crypto_ctx *)(rb + 0x60),re,l - (long)re,
                                     *(uint8_t **)(rb + 0x240),&outl);
          if (zip._4_4_ < 0) {
            archive_set_error((archive *)buff_local,-1,"Failed to encrypt file");
            return -0x19;
          }
          __hmac_sha1_update((archive_hmac_sha1_ctx *)(rb + 0xc0),*(uint8_t **)(rb + 0x240),outl);
        }
        else {
          uVar1 = trad_enc_encrypt_update
                            ((trad_enc_ctx *)(rb + 0x4c),re,l - (long)re,*(uint8_t **)(rb + 0x240),
                             *(size_t *)(rb + 0x238));
          outl = (size_t)uVar1;
        }
        iVar2 = __archive_write_output((archive_write *)buff_local,*(void **)(rb + 0x240),outl);
        if (iVar2 != 0) {
          return (long)iVar2;
        }
        *(size_t *)(rb + 0x18) = outl + *(long *)(rb + 0x18);
        *(size_t *)(rb + 0x108) = outl + *(long *)(rb + 0x108);
        zip._4_4_ = 0;
      }
    }
  }
  else if (iVar2 == 8) {
    *(size_t *)(rb + 0x138) = s_local;
    *(int *)(rb + 0x140) = (int)sStack_28;
    do {
      zip._4_4_ = deflate(rb + 0x138,0);
      if (zip._4_4_ == -2) {
        return -0x1e;
      }
      if (*(int *)(rb + 0x158) == 0) {
        if (rb[0x58] == '\0') {
          if (rb[0xb8] != '\0') {
            zret = *(size_t *)(rb + 0x238);
            zip._4_4_ = aes_ctr_update((archive_crypto_ctx *)(rb + 0x60),*(uint8_t **)(rb + 0x240),
                                       *(size_t *)(rb + 0x238),*(uint8_t **)(rb + 0x240),&zret);
            if (zip._4_4_ < 0) {
              archive_set_error((archive *)buff_local,-1,"Failed to encrypt file");
              return -0x19;
            }
            __hmac_sha1_update((archive_hmac_sha1_ctx *)(rb + 0xc0),*(uint8_t **)(rb + 0x240),
                               *(size_t *)(rb + 0x238));
          }
        }
        else {
          trad_enc_encrypt_update
                    ((trad_enc_ctx *)(rb + 0x4c),*(uint8_t **)(rb + 0x240),*(size_t *)(rb + 0x238),
                     *(uint8_t **)(rb + 0x240),*(size_t *)(rb + 0x238));
        }
        iVar2 = __archive_write_output
                          ((archive_write *)buff_local,*(void **)(rb + 0x240),
                           *(size_t *)(rb + 0x238));
        if (iVar2 != 0) {
          return (long)iVar2;
        }
        *(long *)(rb + 0x18) = *(long *)(rb + 0x238) + *(long *)(rb + 0x18);
        *(long *)(rb + 0x108) = *(long *)(rb + 0x238) + *(long *)(rb + 0x108);
        *(undefined8 *)(rb + 0x150) = *(undefined8 *)(rb + 0x240);
        *(int *)(rb + 0x158) = (int)*(undefined8 *)(rb + 0x238);
        zip._4_4_ = 0;
      }
    } while (*(int *)(rb + 0x140) != 0);
  }
  else {
    if (iVar2 == 0xe) {
      if (rb[0x138] != '\0') {
        stack0xffffffffffffff8f = 0x50205;
        buf[0] = '\0';
        lzma_lzma_props_encode((lzma_options_lzma *)(rb + 0x140),auStack_6d);
        header = (uint8_t *)0x9;
        if ((rb[0x58] == '\0') && (rb[0xb8] == '\0')) {
          iVar2 = __archive_write_output((archive_write *)buff_local,(void *)((long)&sh + 7),9);
          if (iVar2 != 0) {
            return (long)iVar2;
          }
          *(long *)(rb + 0x108) = *(long *)(rb + 0x108) + 9;
          *(long *)(rb + 0x18) = *(long *)(rb + 0x18) + 9;
          zip._4_4_ = 0;
        }
        else {
          l_1 = (size_t)(buf + 1);
          for (rh = (uint8_t *)((long)&sh + 7); rh < l_1; rh = rh + outl_2) {
            if (rb[0x58] == '\0') {
              outl_2 = *(size_t *)(rb + 0x238);
              zip._4_4_ = aes_ctr_update((archive_crypto_ctx *)(rb + 0x60),rh,l_1 - (long)rh,
                                         *(uint8_t **)(rb + 0x240),&outl_2);
              if (zip._4_4_ < 0) {
                archive_set_error((archive *)buff_local,-1,"Failed to encrypt file");
                return -0x19;
              }
              __hmac_sha1_update((archive_hmac_sha1_ctx *)(rb + 0xc0),*(uint8_t **)(rb + 0x240),
                                 outl_2);
            }
            else {
              uVar1 = trad_enc_encrypt_update
                                ((trad_enc_ctx *)(rb + 0x4c),rh,l_1 - (long)rh,
                                 *(uint8_t **)(rb + 0x240),*(size_t *)(rb + 0x238));
              outl_2 = (size_t)uVar1;
            }
            iVar2 = __archive_write_output
                              ((archive_write *)buff_local,*(void **)(rb + 0x240),outl_2);
            if (iVar2 != 0) {
              return (long)iVar2;
            }
            *(size_t *)(rb + 0x18) = outl_2 + *(long *)(rb + 0x18);
            *(size_t *)(rb + 0x108) = outl_2 + *(long *)(rb + 0x108);
            zip._4_4_ = 0;
          }
        }
        rb[0x138] = '\0';
      }
    }
    else {
      if (iVar2 == 0x5d) {
        *(size_t *)(rb + 0x140) = s_local;
        *(size_t *)(rb + 0x148) = sStack_28;
        rb[0x150] = '\0';
        rb[0x151] = '\0';
        rb[0x152] = '\0';
        rb[0x153] = '\0';
        rb[0x154] = '\0';
        rb[0x155] = '\0';
        rb[0x156] = '\0';
        rb[0x157] = '\0';
        do {
          uVar4 = ZSTD_compressStream(*(undefined8 *)(rb + 0x138),rb + 0x158,rb + 0x140);
          iVar2 = ZSTD_isError(uVar4);
          if (iVar2 != 0) {
            return -0x1e;
          }
          if (*(long *)(rb + 0x168) == *(long *)(rb + 0x160)) {
            if (rb[0x58] == '\0') {
              if (rb[0xb8] != '\0') {
                buf._1_8_ = *(undefined8 *)(rb + 0x238);
                zip._4_4_ = aes_ctr_update((archive_crypto_ctx *)(rb + 0x60),
                                           *(uint8_t **)(rb + 0x240),*(size_t *)(rb + 0x238),
                                           *(uint8_t **)(rb + 0x240),(size_t *)(buf + 1));
                if (zip._4_4_ < 0) {
                  archive_set_error((archive *)buff_local,-1,"Failed to encrypt file");
                  return -0x19;
                }
                __hmac_sha1_update((archive_hmac_sha1_ctx *)(rb + 0xc0),*(uint8_t **)(rb + 0x240),
                                   *(size_t *)(rb + 0x238));
              }
            }
            else {
              trad_enc_encrypt_update
                        ((trad_enc_ctx *)(rb + 0x4c),*(uint8_t **)(rb + 0x240),
                         *(size_t *)(rb + 0x238),*(uint8_t **)(rb + 0x240),*(size_t *)(rb + 0x238));
            }
            iVar2 = __archive_write_output
                              ((archive_write *)buff_local,*(void **)(rb + 0x240),
                               *(size_t *)(rb + 0x238));
            if (iVar2 != 0) {
              return (long)iVar2;
            }
            *(long *)(rb + 0x18) = *(long *)(rb + 0x238) + *(long *)(rb + 0x18);
            *(long *)(rb + 0x108) = *(long *)(rb + 0x238) + *(long *)(rb + 0x108);
            *(undefined8 *)(rb + 0x158) = *(undefined8 *)(rb + 0x240);
            *(undefined8 *)(rb + 0x160) = *(undefined8 *)(rb + 0x238);
            rb[0x168] = '\0';
            rb[0x169] = '\0';
            rb[0x16a] = '\0';
            rb[0x16b] = '\0';
            rb[0x16c] = '\0';
            rb[0x16d] = '\0';
            rb[0x16e] = '\0';
            rb[0x16f] = '\0';
            zip._4_4_ = 0;
          }
        } while (*(long *)(rb + 0x150) != *(long *)(rb + 0x148));
        goto LAB_001cc8a3;
      }
      if (iVar2 != 0x5f) goto LAB_001cc882;
    }
    *(size_t *)(rb + 0x1b0) = s_local;
    *(size_t *)(rb + 0x1b8) = sStack_28 & 0xffffffff;
    do {
      zip._4_4_ = lzma_code(rb + 0x1b0,0);
      if (zip._4_4_ == 5) {
        return -0x1e;
      }
      if (*(long *)(rb + 0x1d0) == 0) {
        if (rb[0x58] == '\0') {
          if (rb[0xb8] != '\0') {
            local_a0 = *(size_t *)(rb + 0x238);
            zip._4_4_ = aes_ctr_update((archive_crypto_ctx *)(rb + 0x60),*(uint8_t **)(rb + 0x240),
                                       *(size_t *)(rb + 0x238),*(uint8_t **)(rb + 0x240),&local_a0);
            if (zip._4_4_ < 0) {
              archive_set_error((archive *)buff_local,-1,"Failed to encrypt file");
              return -0x19;
            }
            __hmac_sha1_update((archive_hmac_sha1_ctx *)(rb + 0xc0),*(uint8_t **)(rb + 0x240),
                               *(size_t *)(rb + 0x238));
          }
        }
        else {
          trad_enc_encrypt_update
                    ((trad_enc_ctx *)(rb + 0x4c),*(uint8_t **)(rb + 0x240),*(size_t *)(rb + 0x238),
                     *(uint8_t **)(rb + 0x240),*(size_t *)(rb + 0x238));
        }
        iVar2 = __archive_write_output
                          ((archive_write *)buff_local,*(void **)(rb + 0x240),
                           *(size_t *)(rb + 0x238));
        if (iVar2 != 0) {
          return (long)iVar2;
        }
        *(long *)(rb + 0x18) = *(long *)(rb + 0x238) + *(long *)(rb + 0x18);
        *(long *)(rb + 0x108) = *(long *)(rb + 0x238) + *(long *)(rb + 0x108);
        *(undefined8 *)(rb + 0x1c8) = *(undefined8 *)(rb + 0x240);
        *(ulong *)(rb + 0x1d0) = *(ulong *)(rb + 0x238) & 0xffffffff;
        zip._4_4_ = 0;
      }
    } while (*(long *)(rb + 0x1b8) != 0);
  }
LAB_001cc8a3:
  *(size_t *)(rb + 0x28) = *(long *)(rb + 0x28) - sStack_28;
  if ((rb[0xb8] == '\0') || (*(int *)(rb + 0x5c) != 2)) {
    uVar3 = (**(code **)(rb + 0xe0))(*(undefined4 *)(rb + 0x38),s_local,sStack_28 & 0xffffffff);
    *(undefined4 *)(rb + 0x38) = uVar3;
  }
  return sStack_28;
}

Assistant:

static ssize_t
archive_write_zip_data(struct archive_write *a, const void *buff, size_t s)
{
	int ret;
	struct zip *zip = a->format_data;

	if ((int64_t)s > zip->entry_uncompressed_limit)
		s = (size_t)zip->entry_uncompressed_limit;
	zip->entry_uncompressed_written += s;

	if (s == 0) return 0;

	if (zip->entry_flags & ZIP_ENTRY_FLAG_ENCRYPTED) {
		switch (zip->entry_encryption) {
		case ENCRYPTION_TRADITIONAL:
			/* Initialize traditional PKWARE encryption context. */
			if (!zip->tctx_valid) {
				ret = init_traditional_pkware_encryption(a);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->tctx_valid = 1;
			}
			break;
		case ENCRYPTION_WINZIP_AES128:
		case ENCRYPTION_WINZIP_AES256:
			if (!zip->cctx_valid) {
				ret = init_winzip_aes_encryption(a);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->cctx_valid = zip->hctx_valid = 1;
			}
			break;
		case ENCRYPTION_NONE:
		default:
			break;
		}
	}

	switch (zip->entry_compression) {
	case COMPRESSION_STORE:
		if (zip->tctx_valid || zip->cctx_valid) {
			const uint8_t *rb = (const uint8_t *)buff;
			const uint8_t * const re = rb + s;

			while (rb < re) {
				size_t l;

				if (zip->tctx_valid) {
					l = trad_enc_encrypt_update(&zip->tctx,
					    rb, re - rb,
					    zip->buf, zip->len_buf);
				} else {
					l = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
					    &zip->cctx,
					    rb, re - rb, zip->buf, &l);
					if (ret < 0) {
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_MISC,
						    "Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
					    zip->buf, l);
				}
				ret = __archive_write_output(a, zip->buf, l);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += l;
				zip->written_bytes += l;
				rb += l;
			}
		} else {
			ret = __archive_write_output(a, buff, s);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->written_bytes += s;
			zip->entry_compressed_written += s;
		}
		break;
#ifdef HAVE_ZLIB_H
	case COMPRESSION_DEFLATE:
		zip->stream.deflate.next_in = (unsigned char*)(uintptr_t)buff;
		zip->stream.deflate.avail_in = (uInt)s;
		do {
			ret = deflate(&zip->stream.deflate, Z_NO_FLUSH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			if (zip->stream.deflate.avail_out == 0) {
				if (zip->tctx_valid) {
					trad_enc_encrypt_update(&zip->tctx,
					    zip->buf, zip->len_buf,
					    zip->buf, zip->len_buf);
				} else if (zip->cctx_valid) {
					size_t outl = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
					    &zip->cctx,
					    zip->buf, zip->len_buf,
					    zip->buf, &outl);
					if (ret < 0) {
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_MISC,
						    "Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
					    zip->buf, zip->len_buf);
				}
				ret = __archive_write_output(a, zip->buf,
					zip->len_buf);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += zip->len_buf;
				zip->written_bytes += zip->len_buf;
				zip->stream.deflate.next_out = zip->buf;
				zip->stream.deflate.avail_out = (uInt)zip->len_buf;
			}
		} while (zip->stream.deflate.avail_in != 0);
		break;
#endif
#if defined(HAVE_ZSTD_H) && HAVE_ZSTD_compressStream
	case COMPRESSION_ZSTD:
		zip->stream.zstd.in.src = buff;
		zip->stream.zstd.in.size = s;
		zip->stream.zstd.in.pos = 0;
		do {
			size_t zret = ZSTD_compressStream(zip->stream.zstd.context,
				&zip->stream.zstd.out, &zip->stream.zstd.in);
			if (ZSTD_isError(zret))
				return (ARCHIVE_FATAL);
			if (zip->stream.zstd.out.pos == zip->stream.zstd.out.size) {
				if (zip->tctx_valid) {
					trad_enc_encrypt_update(&zip->tctx,
						zip->buf, zip->len_buf,
						zip->buf, zip->len_buf);
				} else if (zip->cctx_valid) {
					size_t outl = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
						&zip->cctx,
						zip->buf, zip->len_buf,
						zip->buf, &outl);
					if (ret < 0) {
						archive_set_error(&a->archive,
							ARCHIVE_ERRNO_MISC,
							"Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
						zip->buf, zip->len_buf);
				}
				ret = __archive_write_output(a, zip->buf,
					zip->len_buf);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += zip->len_buf;
				zip->written_bytes += zip->len_buf;
				zip->stream.zstd.out.dst = zip->buf;
				zip->stream.zstd.out.size = zip->len_buf;
				zip->stream.zstd.out.pos = 0;
			}
		} while (zip->stream.zstd.in.pos != zip->stream.zstd.in.size);
		break;
#endif
#ifdef HAVE_BZLIB_H
	case COMPRESSION_BZIP2:
		zip->stream.bzip2.next_in = (char*)(uintptr_t)buff;
		zip->stream.bzip2.avail_in = (unsigned int)s;
		do {
			ret = BZ2_bzCompress(&zip->stream.bzip2, BZ_RUN);
			if (ret != BZ_RUN_OK)
				return (ARCHIVE_FATAL);
			if (zip->stream.bzip2.avail_out == 0) {
				if (zip->tctx_valid) {
					trad_enc_encrypt_update(&zip->tctx,
						zip->buf, zip->len_buf,
						zip->buf, zip->len_buf);
				} else if (zip->cctx_valid) {
					size_t outl = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
						&zip->cctx,
						zip->buf, zip->len_buf,
						zip->buf, &outl);
					if (ret < 0) {
						archive_set_error(&a->archive,
							ARCHIVE_ERRNO_MISC,
							"Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
						zip->buf, zip->len_buf);
				}
				ret = __archive_write_output(a, zip->buf,
					zip->len_buf);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += zip->len_buf;
				zip->written_bytes += zip->len_buf;
				zip->stream.bzip2.next_out = (char*)zip->buf;
				zip->stream.bzip2.avail_out = (unsigned int)zip->len_buf;
			}
		} while (zip->stream.bzip2.avail_in != 0);
		break;
#endif
#ifdef HAVE_LZMA_H
	case COMPRESSION_LZMA:
		if (zip->stream.lzma.headers_to_write) {
			/* LZMA Alone and ZIP's LZMA format (i.e. id 14) are almost
			 * the same. Here's an example of a structure of LZMA Alone:
			 *
			 * $ cat /bin/ls | lzma | xxd | head -n 1
			 * 00000000: 5d00 0080 00ff ffff ffff ffff ff00 2814
			 *
			 *    5 bytes        8 bytes        n bytes
			 * <lzma_params><uncompressed_size><data...>
			 *
			 * lzma_params is a 5-byte blob that has to be decoded to
			 * extract parameters of this LZMA stream. The
			 * uncompressed_size field is an uint64_t value that contains
			 * information about the size of the uncompressed file, or
			 * UINT64_MAX if this value is unknown. The <data...> part is
			 * the actual LZMA-compressed data stream.
			 *
			 * Now here's the structure of ZIP's LZMA format:
			 *
			 * $ cat stream_inside_zipx | xxd | head -n 1
			 * 00000000: 0914 0500 5d00 8000 0000 2814 .... ....
			 *
			 *  2byte   2byte    5 bytes     n bytes
			 * <magic1><magic2><lzma_params><data...>
			 *
			 * This means that ZIP's LZMA format contains an additional
			 * magic1 and magic2 headers, the lzma_params field contains
			 * the same parameter set as in LZMA Alone, and the <data...>
			 * field is the same as in LZMA Alone as well. However, note
			 * that ZIP's format is missing the uncompressed_size field.
			 *
			 * So we need to write a raw LZMA stream, set up for LZMA1
			 * (i.e. the algorithm variant LZMA Alone uses), which was
			 * done above in the initialisation but first we need to
			 * write ZIP's LZMA header, as if it were Stored data. Then
			 * we can use the raw stream as if it were any other. magic1
			 * being version numbers and magic2 being lzma_params's size,
			 * they get written in without further ado but lzma_params
			 * requires to use other functions than the usual lzma_stream
			 * manipulating ones, hence the additional book-keeping
			 * required alongside the lzma_stream.
			 */
			uint8_t buf[9] = { LZMA_VERSION_MAJOR, LZMA_VERSION_MINOR, 5, 0 };
			lzma_lzma_props_encode(&zip->stream.lzma.options, buf + 4);
			const size_t sh = 9;
			if (zip->tctx_valid || zip->cctx_valid) {
				uint8_t* header = buf;
				const uint8_t * const rh = header + sh;

				while (header < rh) {
					size_t l;

					if (zip->tctx_valid) {
						l = trad_enc_encrypt_update(&zip->tctx,
							header, rh - header,
							zip->buf, zip->len_buf);
					} else {
						l = zip->len_buf;
						ret = archive_encrypto_aes_ctr_update(
							&zip->cctx,
							header, rh - header, zip->buf, &l);
						if (ret < 0) {
							archive_set_error(&a->archive,
								ARCHIVE_ERRNO_MISC,
								"Failed to encrypt file");
							return (ARCHIVE_FAILED);
						}
						archive_hmac_sha1_update(&zip->hctx,
							zip->buf, l);
					}
					ret = __archive_write_output(a, zip->buf, l);
					if (ret != ARCHIVE_OK)
						return (ret);
					zip->entry_compressed_written += l;
					zip->written_bytes += l;
					header += l;
				}
			} else {
				ret = __archive_write_output(a, buf, sh);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->written_bytes += sh;
				zip->entry_compressed_written += sh;
			}
			zip->stream.lzma.headers_to_write = 0;
		}
		/* FALLTHROUGH */
	case COMPRESSION_XZ:
		zip->stream.lzma.context.next_in = (unsigned char*)(uintptr_t)buff;
		zip->stream.lzma.context.avail_in = (unsigned int)s;
		do {
			ret = lzma_code(&zip->stream.lzma.context, LZMA_RUN);
			if (ret == LZMA_MEM_ERROR)
				return (ARCHIVE_FATAL);
			if (zip->stream.lzma.context.avail_out == 0) {
				if (zip->tctx_valid) {
					trad_enc_encrypt_update(&zip->tctx,
						zip->buf, zip->len_buf,
						zip->buf, zip->len_buf);
				} else if (zip->cctx_valid) {
					size_t outl = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
						&zip->cctx,
						zip->buf, zip->len_buf,
						zip->buf, &outl);
					if (ret < 0) {
						archive_set_error(&a->archive,
							ARCHIVE_ERRNO_MISC,
							"Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
						zip->buf, zip->len_buf);
				}
				ret = __archive_write_output(a, zip->buf,
					zip->len_buf);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += zip->len_buf;
				zip->written_bytes += zip->len_buf;
				zip->stream.lzma.context.next_out = zip->buf;
				zip->stream.lzma.context.avail_out = (unsigned int)zip->len_buf;
			}
		} while (zip->stream.lzma.context.avail_in != 0);
		break;
#endif
	case COMPRESSION_UNSPECIFIED:
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid ZIP compression type");
		return ARCHIVE_FATAL;
	}

	zip->entry_uncompressed_limit -= s;
	if (!zip->cctx_valid || zip->aes_vendor != AES_VENDOR_AE_2)
		zip->entry_crc32 =
		    zip->crc32func(zip->entry_crc32, buff, (unsigned)s);
	return (s);
}